

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

Vec_Int_t * Saig_ManCbaReason2Inputs(Saig_ManCba_t *p,Vec_Int_t *vReasons)

{
  uint uVar1;
  long lVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  void *__s;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  iVar4 = p->pAig->nTruePis;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (void *)0x0;
    p_00->pArray = (int *)0x0;
    piVar3 = (int *)malloc(0x10);
    *piVar3 = 0;
    piVar3[2] = 0;
    piVar3[3] = 0;
    piVar3[1] = iVar4;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
    p_00->pArray = piVar3;
    piVar3 = (int *)malloc(0x10);
    *piVar3 = iVar5;
    __s = malloc((long)iVar5 << 2);
    *(void **)(piVar3 + 2) = __s;
    piVar3[1] = iVar4;
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)iVar4 << 2);
    }
  }
  if (0 < vReasons->nSize) {
    lVar7 = 0;
    do {
      if (vReasons->pArray[lVar7] < 0) {
LAB_00610e61:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vReasons->pArray[lVar7] * 2;
      if (p->vMapPiF2A->nSize <= (int)uVar1) goto LAB_00610e61;
      uVar1 = p->vMapPiF2A->pArray[uVar1];
      uVar6 = (ulong)uVar1;
      if (((int)uVar1 < p->nInputs) || (p->pAig->nObjs[2] <= (int)uVar1)) {
        __assert_fail("iInput >= p->nInputs && iInput < Aig_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0xcc,"Vec_Int_t *Saig_ManCbaReason2Inputs(Saig_ManCba_t *, Vec_Int_t *)");
      }
      if (((int)uVar1 < 0) || (piVar3[1] <= (int)uVar1)) goto LAB_00610e61;
      lVar2 = *(long *)(piVar3 + 2);
      iVar4 = *(int *)(lVar2 + uVar6 * 4);
      if (iVar4 == 0) {
        Vec_IntPush(p_00,uVar1 - p->nInputs);
        iVar4 = *(int *)(lVar2 + uVar6 * 4);
      }
      *(int *)(lVar2 + uVar6 * 4) = iVar4 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vReasons->nSize);
    __s = *(void **)(piVar3 + 2);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(piVar3);
  return p_00;
}

Assistant:

Vec_Int_t * Saig_ManCbaReason2Inputs( Saig_ManCba_t * p, Vec_Int_t * vReasons )
{
    Vec_Int_t * vOriginal, * vVisited;
    int i, Entry;
    vOriginal = Vec_IntAlloc( Saig_ManPiNum(p->pAig) ); 
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        assert( iInput >= p->nInputs && iInput < Aig_ManCiNum(p->pAig) );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            Vec_IntPush( vOriginal, iInput - p->nInputs );
        Vec_IntAddToEntry( vVisited, iInput, 1 );
    }
    Vec_IntFree( vVisited );
    return vOriginal;
}